

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_pq_t * create_pq(roaring_bitmap_t **arr,uint32_t length)

{
  roaring_pq_t *pq;
  roaring_pq_element_t *prVar1;
  size_t sVar2;
  uint32_t local_28;
  uint local_24;
  int32_t i_1;
  uint32_t i;
  roaring_pq_t *answer;
  uint32_t length_local;
  roaring_bitmap_t **arr_local;
  
  pq = (roaring_pq_t *)malloc(0x10);
  prVar1 = (roaring_pq_element_t *)malloc((ulong)length * 0x18);
  pq->elements = prVar1;
  pq->size = (ulong)length;
  for (local_24 = 0; local_24 < length; local_24 = local_24 + 1) {
    pq->elements[local_24].bitmap = arr[local_24];
    pq->elements[local_24].is_temporary = false;
    sVar2 = roaring_bitmap_portable_size_in_bytes(arr[local_24]);
    pq->elements[local_24].size = sVar2;
  }
  for (local_28 = length >> 1; -1 < (int)local_28; local_28 = local_28 - 1) {
    percolate_down(pq,local_28);
  }
  return pq;
}

Assistant:

static roaring_pq_t *create_pq(const roaring_bitmap_t **arr, uint32_t length) {
    roaring_pq_t *answer = (roaring_pq_t *)malloc(sizeof(roaring_pq_t));
    answer->elements =
        (roaring_pq_element_t *)malloc(sizeof(roaring_pq_element_t) * length);
    answer->size = length;
    for (uint32_t i = 0; i < length; i++) {
        answer->elements[i].bitmap = (roaring_bitmap_t *)arr[i];
        answer->elements[i].is_temporary = false;
        answer->elements[i].size =
            roaring_bitmap_portable_size_in_bytes(arr[i]);
    }
    for (int32_t i = (length >> 1); i >= 0; i--) {
        percolate_down(answer, i);
    }
    return answer;
}